

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

uint32_t utrie_get32_63(UNewTrie *trie,UChar32 c,UBool *pInBlockZero)

{
  int iVar1;
  int iVar2;
  
  if (((trie != (UNewTrie *)0x0) && ((uint)c < 0x110000)) && (trie->isCompacted == '\0')) {
    iVar1 = trie->index[(uint)c >> 5];
    if (pInBlockZero != (UBool *)0x0) {
      *pInBlockZero = iVar1 == 0;
    }
    iVar2 = -iVar1;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    return trie->data[(c & 0x1fU) + iVar2];
  }
  if (pInBlockZero != (UBool *)0x0) {
    *pInBlockZero = '\x01';
  }
  return 0;
}

Assistant:

U_CAPI uint32_t U_EXPORT2
utrie_get32(UNewTrie *trie, UChar32 c, UBool *pInBlockZero) {
    int32_t block;

    /* valid, uncompacted trie and valid c? */
    if(trie==NULL || trie->isCompacted || (uint32_t)c>0x10ffff) {
        if(pInBlockZero!=NULL) {
            *pInBlockZero=TRUE;
        }
        return 0;
    }

    block=trie->index[c>>UTRIE_SHIFT];
    if(pInBlockZero!=NULL) {
        *pInBlockZero= (UBool)(block==0);
    }

    return trie->data[ABS(block)+(c&UTRIE_MASK)];
}